

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O0

void __thiscall
aeron::BufferBuilder::ensureCapacity(BufferBuilder *this,uint32_t additionalCapacity)

{
  uint requiredCapacity_00;
  uchar *__p;
  type __dest;
  type __src;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_28;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> newBuffer;
  uint32_t newCapacity;
  uint32_t requiredCapacity;
  uint32_t additionalCapacity_local;
  BufferBuilder *this_local;
  
  requiredCapacity_00 = this->m_limit + additionalCapacity;
  if (this->m_capacity < requiredCapacity_00) {
    newBuffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ =
         findSuitableCapacity(this->m_capacity,requiredCapacity_00);
    __p = (uchar *)operator_new__((ulong)newBuffer._M_t.
                                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl
                                         ._4_4_);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
              ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&local_28,__p);
    __dest = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       (&local_28,0);
    __src = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                      (&this->m_buffer,0);
    memcpy(__dest,__src,(ulong)this->m_limit);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              (&this->m_buffer,&local_28);
    this->m_capacity =
         newBuffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
         _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_28);
  }
  return;
}

Assistant:

void ensureCapacity(std::uint32_t additionalCapacity)
    {
        const std::uint32_t requiredCapacity = m_limit + additionalCapacity;

        if (requiredCapacity > m_capacity)
        {
            const std::uint32_t newCapacity = findSuitableCapacity(m_capacity, requiredCapacity);
            std::unique_ptr<std::uint8_t[]> newBuffer(new std::uint8_t[newCapacity]);

            ::memcpy(&newBuffer[0], &m_buffer[0], m_limit);
            m_buffer = std::move(newBuffer);
            m_capacity = newCapacity;
        }
    }